

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O1

void us_socket_timeout(int ssl,us_socket_t *s,uint seconds)

{
  short sVar1;
  unsigned_short uVar2;
  
  if (seconds == 0) {
    uVar2 = 0;
  }
  else {
    sVar1 = (short)(int)((float)seconds * 0.25 + 0.5);
    uVar2 = sVar1 + (ushort)(sVar1 == 0);
  }
  s->timeout = uVar2;
  return;
}

Assistant:

void us_socket_timeout(int ssl, struct us_socket_t *s, unsigned int seconds) {
    if (seconds) {
        unsigned short timeout_sweeps = (unsigned short) (0.5f + ((float) seconds) / ((float) LIBUS_TIMEOUT_GRANULARITY));
        s->timeout = timeout_sweeps ? timeout_sweeps : 1;
    } else {
        s->timeout = 0;
    }
}